

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slice.h
# Opt level: O2

Slice __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::value
          (SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this)

{
  uint8_t *start;
  byte bVar1;
  
  if ((**(byte **)this & 0xfe) != 0xee) {
    return (Slice)*(byte **)this;
  }
  start = *(uint8_t **)this;
  bVar1 = tagsOffset(this,start);
  return (Slice)(start + bVar1);
}

Assistant:

uint8_t const* getDataPtr() const noexcept { return _start; }